

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O2

bool S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
               (S2Point *target_point,Iterator *it)

{
  ulong uVar1;
  bool bVar2;
  uint64 in_RAX;
  S2CellId target;
  S2CellId local_18;
  
  local_18.id_ = in_RAX;
  S2CellId::S2CellId(&local_18,target_point);
  MutableS2ShapeIndex::Iterator::Seek(it,local_18);
  uVar1 = (it->super_IteratorBase).id_.id_;
  if ((uVar1 == 0xffffffffffffffff) || (bVar2 = true, local_18.id_ < uVar1 - (~uVar1 & uVar1 - 1)))
  {
    bVar2 = MutableS2ShapeIndex::Iterator::Prev(it);
    if ((!bVar2) ||
       (uVar1 = (it->super_IteratorBase).id_.id_, bVar2 = true, (uVar1 - 1 | uVar1) < local_18.id_))
    {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::LocateImpl(
    const S2Point& target_point, Iter* it) {
  // Let I = cell_map_->lower_bound(T), where T is the leaf cell containing
  // "target_point".  Then if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  S2CellId target(target_point);
  it->Seek(target);
  if (!it->done() && it->id().range_min() <= target) return true;
  if (it->Prev() && it->id().range_max() >= target) return true;
  return false;
}